

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

CSVOption<char> __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::CSVOption<char>>
          (Deserializer *this,field_id_t field_id,char *tag,CSVOption<char> default_value)

{
  CSVOption<char> CVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  
  uVar2 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar2 != '\0') {
    default_value = Read<duckdb::CSVOption<char>>(this);
  }
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar2 & 0xff));
  CVar1.set_by_user = default_value.set_by_user;
  CVar1.value = default_value.value;
  return CVar1;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}